

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

void xmlFreeStreamCtxt(xmlStreamCtxtPtr stream)

{
  _xmlStreamCtxt *p_Var1;
  
  while (stream != (xmlStreamCtxtPtr)0x0) {
    p_Var1 = stream->next;
    if (stream->states != (int *)0x0) {
      (*xmlFree)(stream->states);
    }
    (*xmlFree)(stream);
    stream = p_Var1;
  }
  return;
}

Assistant:

void
xmlFreeStreamCtxt(xmlStreamCtxtPtr stream) {
    xmlStreamCtxtPtr next;

    while (stream != NULL) {
        next = stream->next;
        if (stream->states != NULL)
	    xmlFree(stream->states);
        xmlFree(stream);
	stream = next;
    }
}